

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

void __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::iterator_base<true>::increment_internal_node(iterator_base<true> *this)

{
  uint uVar1;
  index_pointer node;
  uint uVar2;
  size_t sVar3;
  reference pvVar4;
  ulong uVar5;
  index_pointer *piVar6;
  index_pointer node_00;
  internal_node *this_00;
  internal_node *this_01;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_58;
  array_stack<pstore::index::details::parent_type,_13UL> *local_38;
  
  sVar3 = (this->visited_parents_).elements_;
  if (sVar3 == 0) {
    assert_failed("elements_ > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                  ,0x6a);
  }
  sVar3 = sVar3 - 1;
  (this->visited_parents_).elements_ = sVar3;
  if (sVar3 == 0) {
    return;
  }
  local_38 = &this->visited_parents_;
  pvVar4 = array_stack<pstore::index::details::parent_type,_13UL>::top(local_38);
  sVar3 = (this->visited_parents_).elements_;
  if (sVar3 == 0) {
    assert_failed("visited_parents_.size () >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0xc9);
  }
  node.addr_.a_ = *(address *)&pvVar4->node;
  uVar7 = pvVar4->position;
  uVar1 = (int)sVar3 * 6 - 6;
  if (uVar1 < 0x42) {
    details::internal_node::get_node(&local_58,this->db_,node);
    local_60 = local_58.first.
               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_58.first.
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58.first.
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    if (local_58.second == (internal_node *)0x0) {
      assert_failed("internal != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x234);
    }
    uVar2 = details::internal_node::size(local_58.second);
    uVar5 = (ulong)uVar2;
    this_00 = (internal_node *)0x0;
    this_01 = local_58.second;
  }
  else {
    details::linear_node::get_node
              ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                *)&local_58,this->db_,node);
    local_60 = local_58.first.
               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    local_58.first.
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58.first.
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    if (local_58.second == (internal_node *)0x0) {
      assert_failed("linear != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x238);
    }
    uVar5 = (local_58.second)->bitmap_;
    this_01 = (internal_node *)0x0;
    this_00 = local_58.second;
  }
  if ((((ulong)node.internal_ & 1) == 0) || (uVar5 <= uVar7)) {
    assert_failed("!parent.node.is_leaf () && parent.position < size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0x23c);
  }
  uVar7 = uVar7 + 1;
  if (uVar7 < uVar5) {
    pvVar4 = array_stack<pstore::index::details::parent_type,_13UL>::top(local_38);
    pvVar4->position = uVar7;
    if (uVar1 < 0x42) {
      piVar6 = details::internal_node::operator[](this_01,uVar7);
      node_00 = *piVar6;
      if (((ulong)node_00.internal_ & 1) != 0) {
        move_to_left_most_child(this,node_00);
        goto LAB_0018688a;
      }
      uVar7 = (this->visited_parents_).elements_;
      if (0xc < uVar7) {
        assert_failed("elements_ < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                      ,100);
      }
    }
    else {
      node_00.internal_ = (internal_node *)details::linear_node::operator[](this_00,uVar7);
      uVar7 = (this->visited_parents_).elements_;
      if (0xc < uVar7) {
        assert_failed("elements_ < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                      ,100);
      }
    }
    (this->visited_parents_).elements_ = uVar7 + 1;
    (local_38->c_)._M_elems[uVar7].node = node_00;
    (local_38->c_)._M_elems[uVar7].position = 0xffffffffffffffff;
  }
  else {
    increment_internal_node(this);
  }
LAB_0018688a:
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return;
}

Assistant:

iterator_base (database_reference db, parent_stack && parents, hamt_map const * idx)
                        : db_{db}
                        , visited_parents_ (std::move (parents))
                        , index_ (idx) {}